

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O3

void __thiscall
FCompressedMemFile::GetSizes(FCompressedMemFile *this,uint *compressed,uint *uncompressed)

{
  uint *puVar1;
  uint uVar2;
  
  puVar1 = (uint *)this->m_ImplodedBuffer;
  if (puVar1 == (uint *)0x0) {
    *compressed = 0;
    uVar2 = (this->super_FCompressedFile).m_BufferSize;
  }
  else {
    uVar2 = *puVar1;
    *compressed = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = puVar1[1];
    uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  *uncompressed = uVar2;
  return;
}

Assistant:

void FCompressedMemFile::GetSizes(unsigned int &compressed, unsigned int &uncompressed) const
{
	if (m_ImplodedBuffer != NULL)
	{
		compressed = BigLong(*(unsigned int *)m_ImplodedBuffer);
		uncompressed = BigLong(*(unsigned int *)(m_ImplodedBuffer + 4));
	}
	else
	{
		compressed = 0;
		uncompressed = m_BufferSize;
	}
}